

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O3

void __thiscall
nigel::IMC_Generator::generateSetAfterOp
          (IMC_Generator *this,OperationCombination comb,shared_ptr<nigel::IM_Operator> *lOp,
          shared_ptr<nigel::Token> *lValToken)

{
  int iVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  undefined1 local_101;
  undefined1 local_100 [24];
  shared_ptr<nigel::Token> local_e8;
  shared_ptr<nigel::IM_Operator> local_d8;
  shared_ptr<nigel::IM_Operator> local_c8;
  shared_ptr<nigel::IM_Operator> local_b8;
  shared_ptr<nigel::IM_Operator> local_a8;
  shared_ptr<nigel::IM_Operator> local_98;
  shared_ptr<nigel::IM_Operator> local_88;
  shared_ptr<nigel::IM_Operator> local_78;
  shared_ptr<nigel::IM_Operator> local_68;
  shared_ptr<nigel::IM_Operator> local_58;
  shared_ptr<nigel::IM_Operator> local_48;
  shared_ptr<nigel::IM_Operator> local_38;
  
  if (comb < cv) {
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_100);
    iVar1 = *(int *)(local_100._0_8_ + 0x1c);
    if ((element_type *)local_100._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
    }
    if (iVar1 == 0) {
      local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if ((element_type *)
          local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((element_type *)
                    local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                   _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(((element_type *)
                         local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                        _M_weak_this.
                        super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((element_type *)
                    local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                   _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(((element_type *)
                         local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                        _M_weak_this.
                        super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
      local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_adr_a,&local_b8,&local_58);
      this_00._M_pi =
           local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
    }
    else {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_100);
      iVar1 = *(int *)(local_100._0_8_ + 0x1c);
      if ((element_type *)local_100._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
      }
      if (iVar1 == 1) {
        local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,&local_c8,&local_68);
        if (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_dptr_a,&local_78,&local_88);
        return;
      }
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_100);
      iVar1 = *(int *)(local_100._0_8_ + 0x1c);
      if ((element_type *)local_100._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
      }
      if ((iVar1 != 4) && (iVar1 != 2)) {
        return;
      }
      local_100._20_4_ = 6;
      std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_100,
                 (allocator<nigel::IM_SFR> *)&local_101,(SFR *)(local_100 + 0x14));
      uVar2 = local_100._8_8_;
      local_38.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_100._0_8_;
      local_38.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_;
      local_100._0_8_ = (element_type *)0x0;
      local_100._8_8_ = (element_type *)0x0;
      local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_adr_a,&local_38,&local_98);
      if ((element_type *)uVar2 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
      }
      if ((element_type *)local_100._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
      }
      local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      generateLoadStackR0(this,&local_d8);
      if (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_100._20_4_ = 6;
      std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_100,
                 (allocator<nigel::IM_SFR> *)&local_101,(SFR *)(local_100 + 0x14));
      uVar2 = local_100._8_8_;
      local_48.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_100._0_8_;
      local_48.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_;
      local_100._0_8_ = (element_type *)0x0;
      local_100._8_8_ = (element_type *)0x0;
      local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_atr0_adr,&local_48,&local_a8);
      this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_;
      if ((element_type *)uVar2 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
        this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_;
      }
    }
  }
  else {
    local_e8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (lValToken->super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_e8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (lValToken->super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    if ((element_type *)
        local_e8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((element_type *)
                  local_e8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->super_enable_shared_from_this<nigel::IM_Operator>)._M_weak_this.
                 super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(((element_type *)
                       local_e8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                      _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((element_type *)
                  local_e8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->super_enable_shared_from_this<nigel::IM_Operator>)._M_weak_this.
                 super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(((element_type *)
                       local_e8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                      _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 1;
      }
    }
    BuilderExecutable::generateNotification
              (&this->super_BuilderExecutable,err_cannotSetAConstantLiteral,&local_e8);
    this_00._M_pi =
         local_e8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  if ((element_type *)this_00._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  return;
}

Assistant:

void IMC_Generator::generateSetAfterOp( OperationCombination comb, std::shared_ptr<IM_Operator> lOp, std::shared_ptr<Token> lValToken )
	{
		if( comb == OC::vv || comb == OC::vc || comb == OC::vt )
		{//Is the same, because after a operation the value will be located in the acc.
			if( lOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_adr_a, lOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_dptr_a );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() )
			{
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::SW ) );
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_atr0_adr, IM_SFR::getSFR( IM_SFR::SFR::SW ) );
			}
		}
		else generateNotification( NT::err_cannotSetAConstantLiteral, lValToken );
	}